

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>::operator()
          (void *this,char *value_text,array<unsigned_long,_5UL> *x)

{
  bool bVar1;
  ostream *poVar2;
  AssertionResult *other;
  array<unsigned_long,_5UL> *in_RCX;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  undefined1 local_390 [8];
  StringMatchResultListener listener;
  stringstream ss;
  ostream local_1e8 [376];
  undefined1 local_70 [8];
  Matcher<const_std::array<unsigned_long,_5UL>_&> matcher;
  AssertionResult local_38;
  
  ElementsAreArrayMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::array<unsigned_long,_5UL>_&> *)local_70,
             (ElementsAreArrayMatcher *)value_text);
  bVar1 = MatcherBase<const_std::array<unsigned_long,_5UL>_&>::Matches
                    ((MatcherBase<const_std::array<unsigned_long,_5UL>_&> *)local_70,in_RCX);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&listener.field_0x190);
    poVar2 = std::operator<<(local_1e8,"Value of: ");
    poVar2 = std::operator<<(poVar2,(char *)x);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Expected: ");
    MatcherBase<const_std::array<unsigned_long,_5UL>_&>::DescribeTo
              ((MatcherBase<const_std::array<unsigned_long,_5UL>_&> *)local_70,local_1e8);
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_390);
    bVar1 = MatchPrintAndExplain<std::array<unsigned_long,5ul>const,std::array<unsigned_long,5ul>const&>
                      (in_RCX,(Matcher<const_std::array<unsigned_long,_5UL>_&> *)local_70,
                       (MatchResultListener *)local_390);
    if (bVar1) {
      std::operator<<(local_1e8,
                      "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                     );
    }
    poVar2 = std::operator<<(local_1e8,"\n  Actual: ");
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar2,(string *)
                           &matcher.super_MatcherBase<const_std::array<unsigned_long,_5UL>_&>.
                            buffer_);
    std::__cxx11::string::~string
              ((string *)&matcher.super_MatcherBase<const_std::array<unsigned_long,_5UL>_&>.buffer_)
    ;
    AssertionFailure();
    std::__cxx11::stringbuf::str();
    other = AssertionResult::operator<<
                      (&local_38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &matcher.super_MatcherBase<const_std::array<unsigned_long,_5UL>_&>.buffer_);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    std::__cxx11::string::~string
              ((string *)&matcher.super_MatcherBase<const_std::array<unsigned_long,_5UL>_&>.buffer_)
    ;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&local_38.message_);
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_390);
    std::__cxx11::stringstream::~stringstream((stringstream *)&listener.field_0x190);
  }
  MatcherBase<const_std::array<unsigned_long,_5UL>_&>::~MatcherBase
            ((MatcherBase<const_std::array<unsigned_long,_5UL>_&> *)local_70);
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }